

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcTrimmedCurve::~IfcTrimmedCurve(IfcTrimmedCurve *this)

{
  ~IfcTrimmedCurve((IfcTrimmedCurve *)((long)&this[-1].SenseAgreement.field_2 + 8));
  return;
}

Assistant:

IfcTrimmedCurve() : Object("IfcTrimmedCurve") {}